

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

shaderDefinition * __thiscall
glcts::TextureCubeMapArraySamplingTest::programDefinition::getShader
          (programDefinition *this,shaderType shader_type)

{
  switch(shader_type) {
  case Compute:
    return this->compute_shader;
  case Fragment:
    return this->fragment_shader;
  case Geometry:
    return this->geometry_shader;
  case Tesselation_Control:
    return this->tesselation_control_shader;
  case Tesselation_Evaluation:
    return this->tesselation_evaluation_shader;
  case Vertex:
    return this->vertex_shader;
  default:
    return (shaderDefinition *)0x0;
  }
}

Assistant:

const TextureCubeMapArraySamplingTest::shaderDefinition* TextureCubeMapArraySamplingTest::programDefinition::getShader(
	shaderType shader_type) const
{
	switch (shader_type)
	{
	case Compute:
		return compute_shader;
		break;
	case Fragment:
		return fragment_shader;
		break;
	case Geometry:
		return geometry_shader;
		break;
	case Tesselation_Control:
		return tesselation_control_shader;
		break;
	case Tesselation_Evaluation:
		return tesselation_evaluation_shader;
		break;
	case Vertex:
		return vertex_shader;
		break;
	}

	return 0;
}